

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpg4d_parser.c
# Opt level: O0

MPP_RET mpg4d_parse_matrix(BitReadCtx_t *gb,RK_U8 *matrix)

{
  RK_S32 RVar1;
  MPP_RET MVar2;
  bool local_31;
  int local_30;
  int local_2c;
  RK_S32 _out;
  RK_S32 value;
  RK_S32 last;
  RK_S32 i;
  RK_U8 *matrix_local;
  BitReadCtx_t *gb_local;
  
  value = 0;
  local_2c = 0;
  RVar1 = value;
  _last = matrix;
  matrix_local = (RK_U8 *)gb;
  do {
    value = RVar1;
    _out = local_2c;
    MVar2 = mpp_read_bits((BitReadCtx_t *)matrix_local,8,&local_30);
    *(MPP_RET *)(matrix_local + 0x44) = MVar2;
    if (*(int *)(matrix_local + 0x44) != 0) {
      return MPP_ERR_STREAM;
    }
    local_2c = local_30;
    _last[value] = (RK_U8)local_30;
    local_31 = local_30 != 0 && value + 1 < 0x40;
    RVar1 = value + 1;
  } while (local_31);
  if (local_30 == 0) {
    while (value < 0x40) {
      _last[value] = (RK_U8)_out;
      value = value + 1;
    }
    gb_local._4_4_ = MPP_OK;
  }
  else {
    gb_local._4_4_ = MPP_ERR_STREAM;
  }
  return gb_local._4_4_;
}

Assistant:

static MPP_RET mpg4d_parse_matrix(BitReadCtx_t *gb, RK_U8 * matrix)
{
    RK_S32 i = 0;
    RK_S32 last, value = 0;

    do {
        last = value;
        READ_BITS(gb, 8, &value);
        matrix[i++] = value;
    } while (value != 0 && i < 64);

    if (value != 0)
        return MPP_ERR_STREAM;

    i--;

    while (i < 64) {
        matrix[i++ ] = last;
    }

    return MPP_OK;

__BITREAD_ERR:
    return MPP_ERR_STREAM;
}